

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test::testBody
          (TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test *this)

{
  MockSupportPlugin *this_00;
  UtestShell *test;
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  DummyCopier copier;
  MockNoWayToCopyCustomTypeFailure failure;
  MockFailureReporterInstaller local_b9;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  MockNamedValueCopier local_88;
  TestFailure local_80;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_b9);
  local_88._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002cb2b0;
  SimpleString::SimpleString((SimpleString *)&local_80,"myType");
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin;
  MockSupportPlugin::installCopier(this_00,(SimpleString *)&local_80,&local_88);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  SimpleString::SimpleString((SimpleString *)&local_80,"");
  pMVar2 = mock((SimpleString *)&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_b8);
  SimpleString::SimpleString(&local_98,"myType");
  SimpleString::SimpleString(&local_a8,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_98,&local_a8,0);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  SimpleString::SimpleString((SimpleString *)&local_80,"");
  pMVar2 = mock((SimpleString *)&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_b8);
  SimpleString::SimpleString(&local_98,"myType");
  SimpleString::SimpleString(&local_a8,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_98,&local_a8,0);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  test = (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test;
  SimpleString::SimpleString(&local_b8,"myType");
  MockNoWayToCopyCustomTypeFailure::MockNoWayToCopyCustomTypeFailure
            ((MockNoWayToCopyCustomTypeFailure *)&local_80,test,&local_b8);
  SimpleString::~SimpleString(&local_b8);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x8b);
  MockSupportPlugin::clear(this_00);
  TestFailure::~TestFailure(&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_b9);
  return;
}

Assistant:

TEST(MockPlugin, installCopierRecordsTheCopierButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyCopier copier;
    plugin.installCopier("myType", copier);
    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("myType", "name", NULLPTR);
    mock().actualCall("foo").withOutputParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCopyCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}